

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walIndexReadHdr(Wal *pWal,int *pChanged)

{
  int local_34;
  u32 *local_30;
  u32 *page0;
  int badHdr;
  int rc;
  int *pChanged_local;
  Wal *pWal_local;
  
  _badHdr = pChanged;
  pChanged_local = (int *)pWal;
  page0._4_4_ = walIndexPage(pWal,0,&local_30);
  pWal_local._4_4_ = page0._4_4_;
  if (page0._4_4_ == 0) {
    if (local_30 == (u32 *)0x0) {
      local_34 = 1;
    }
    else {
      local_34 = walIndexTryHdr((Wal *)pChanged_local,_badHdr);
    }
    page0._0_4_ = local_34;
    if (local_34 != 0) {
      if ((*(byte *)((long)pChanged_local + 0x42) & 2) == 0) {
        page0._4_4_ = walLockExclusive((Wal *)pChanged_local,0,1);
        if (page0._4_4_ == 0) {
          *(undefined1 *)(pChanged_local + 0x10) = 1;
          page0._4_4_ = walIndexPage((Wal *)pChanged_local,0,&local_30);
          if ((page0._4_4_ == 0) &&
             (page0._0_4_ = walIndexTryHdr((Wal *)pChanged_local,_badHdr), (int)page0 != 0)) {
            page0._4_4_ = walIndexRecover((Wal *)pChanged_local);
            *_badHdr = 1;
          }
          *(undefined1 *)(pChanged_local + 0x10) = 0;
          walUnlockExclusive((Wal *)pChanged_local,0,1);
        }
      }
      else {
        page0._4_4_ = walLockShared((Wal *)pChanged_local,0);
        if (page0._4_4_ == 0) {
          walUnlockShared((Wal *)pChanged_local,0);
          page0._4_4_ = 0x108;
        }
      }
    }
    if (((int)page0 == 0) && (pChanged_local[0x12] != 0x2de218)) {
      page0._4_4_ = sqlite3CantopenError(0xdf24);
    }
    pWal_local._4_4_ = page0._4_4_;
  }
  return pWal_local._4_4_;
}

Assistant:

static int walIndexReadHdr(Wal *pWal, int *pChanged){
  int rc;                         /* Return code */
  int badHdr;                     /* True if a header read failed */
  volatile u32 *page0;            /* Chunk of wal-index containing header */

  /* Ensure that page 0 of the wal-index (the page that contains the 
  ** wal-index header) is mapped. Return early if an error occurs here.
  */
  assert( pChanged );
  rc = walIndexPage(pWal, 0, &page0);
  if( rc!=SQLITE_OK ){
    return rc;
  };
  assert( page0 || pWal->writeLock==0 );

  /* If the first page of the wal-index has been mapped, try to read the
  ** wal-index header immediately, without holding any lock. This usually
  ** works, but may fail if the wal-index header is corrupt or currently 
  ** being modified by another thread or process.
  */
  badHdr = (page0 ? walIndexTryHdr(pWal, pChanged) : 1);

  /* If the first attempt failed, it might have been due to a race
  ** with a writer.  So get a WRITE lock and try again.
  */
  assert( badHdr==0 || pWal->writeLock==0 );
  if( badHdr ){
    if( pWal->readOnly & WAL_SHM_RDONLY ){
      if( SQLITE_OK==(rc = walLockShared(pWal, WAL_WRITE_LOCK)) ){
        walUnlockShared(pWal, WAL_WRITE_LOCK);
        rc = SQLITE_READONLY_RECOVERY;
      }
    }else if( SQLITE_OK==(rc = walLockExclusive(pWal, WAL_WRITE_LOCK, 1)) ){
      pWal->writeLock = 1;
      if( SQLITE_OK==(rc = walIndexPage(pWal, 0, &page0)) ){
        badHdr = walIndexTryHdr(pWal, pChanged);
        if( badHdr ){
          /* If the wal-index header is still malformed even while holding
          ** a WRITE lock, it can only mean that the header is corrupted and
          ** needs to be reconstructed.  So run recovery to do exactly that.
          */
          rc = walIndexRecover(pWal);
          *pChanged = 1;
        }
      }
      pWal->writeLock = 0;
      walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
    }
  }

  /* If the header is read successfully, check the version number to make
  ** sure the wal-index was not constructed with some future format that
  ** this version of SQLite cannot understand.
  */
  if( badHdr==0 && pWal->hdr.iVersion!=WALINDEX_MAX_VERSION ){
    rc = SQLITE_CANTOPEN_BKPT;
  }

  return rc;
}